

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::parse
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,string_t *file_name)

{
  value_type ptVar1;
  bool bVar2;
  lexeme_type_t lVar3;
  reference pptVar4;
  string_t *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long in_RDI;
  lexical_analyzer_t<cfgfile::string_trait_t> *in_stack_000003a8;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  lexeme_t<cfgfile::string_trait_t> *in_stack_fffffffffffffbf8;
  lexeme_t<cfgfile::string_trait_t> *in_stack_fffffffffffffc00;
  string_t *in_stack_fffffffffffffc08;
  parser_info_t<cfgfile::string_trait_t> *in_stack_fffffffffffffc10;
  exception_t<cfgfile::string_trait_t> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  exception_t<cfgfile::string_trait_t> local_2a1 [2];
  parser_base_t<cfgfile::string_trait_t> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c9 [7];
  child_tags_list_t *in_stack_ffffffffffffff30;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff38;
  parser_conffile_impl_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff40;
  undefined1 local_a8 [48];
  undefined1 local_78 [64];
  lexeme_t<cfgfile::string_trait_t> local_38;
  
  bVar2 = start_first_tag_parsing
                    ((parser_conffile_impl_t<cfgfile::string_trait_t> *)
                     lexeme.m_value.field_2._M_allocated_capacity);
  if (bVar2) {
    lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(in_stack_000003a8);
    while (bVar2 = lexeme_t<cfgfile::string_trait_t>::is_null(&local_38), ((bVar2 ^ 0xffU) & 1) != 0
          ) {
      bVar2 = std::
              stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::empty((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                       *)0x145dc7);
      if (bVar2) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x30);
        __lhs = local_1c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)__lhs,(allocator<char> *)__rhs);
        string_trait_t::from_ascii((string *)in_stack_fffffffffffffbf8);
        lexeme_t<cfgfile::string_trait_t>::value_abi_cxx11_(&local_38);
        std::operator+(in_stack_fffffffffffffc08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)__lhs,(allocator<char> *)__rhs);
        string_trait_t::from_ascii((string *)in_stack_fffffffffffffbf8);
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)__lhs,(allocator<char> *)__rhs);
        string_trait_t::from_ascii((string *)in_stack_fffffffffffffbf8);
        std::operator+(__lhs,__rhs);
        std::operator+(in_stack_fffffffffffffc08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc00);
        this_00 = local_2a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)__lhs,(allocator<char> *)__rhs);
        string_trait_t::from_ascii((string *)in_stack_fffffffffffffbf8);
        std::operator+(__lhs,__rhs);
        psVar5 = (string_t *)
                 lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                           ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
        string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffbf8);
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)__lhs,(allocator<char> *)__rhs);
        string_trait_t::from_ascii((string *)in_stack_fffffffffffffbf8);
        std::operator+(__lhs,__rhs);
        exception_t<cfgfile::string_trait_t>::exception_t(this_00,psVar5);
        __cxa_throw(__rhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
      lVar3 = lexeme_t<cfgfile::string_trait_t>::type(&local_38);
      if (lVar3 == start) {
        std::
        stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::top((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
               *)0x145e56);
        pptVar4 = std::
                  stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::top((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                         *)0x145e84);
        (*(*pptVar4)->_vptr_tag_t[2])();
        start_tag_parsing(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30);
      }
      else if (lVar3 == finish) {
        pptVar4 = std::
                  stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::top((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                         *)0x145fe2);
        ptVar1 = *pptVar4;
        lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                  ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
        in_stack_fffffffffffffc40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             lexical_analyzer_t<cfgfile::string_trait_t>::column_number
                       ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
        parser_info_t<cfgfile::string_trait_t>::parser_info_t
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   (pos_t)in_stack_fffffffffffffc00,(pos_t)in_stack_fffffffffffffbf8);
        (*ptVar1->_vptr_tag_t[5])(ptVar1,local_a8);
        parser_info_t<cfgfile::string_trait_t>::~parser_info_t
                  ((parser_info_t<cfgfile::string_trait_t> *)0x146076);
        std::
        stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::pop((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
               *)0x146087);
      }
      else if (lVar3 == string) {
        pptVar4 = std::
                  stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::top((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                         *)0x145ee1);
        ptVar1 = *pptVar4;
        lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                  ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
        lexical_analyzer_t<cfgfile::string_trait_t>::column_number
                  ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
        parser_info_t<cfgfile::string_trait_t>::parser_info_t
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   (pos_t)in_stack_fffffffffffffc00,(pos_t)in_stack_fffffffffffffbf8);
        psVar5 = lexeme_t<cfgfile::string_trait_t>::value_abi_cxx11_(&local_38);
        (*ptVar1->_vptr_tag_t[6])(ptVar1,local_78,psVar5);
        parser_info_t<cfgfile::string_trait_t>::~parser_info_t
                  ((parser_info_t<cfgfile::string_trait_t> *)0x145fa6);
      }
      lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(in_stack_000003a8);
      lexeme_t<cfgfile::string_trait_t>::operator=
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      lexeme_t<cfgfile::string_trait_t>::~lexeme_t((lexeme_t<cfgfile::string_trait_t> *)0x1466bf);
    }
    parser_base_t<cfgfile::string_trait_t>::check_parser_state_after_parsing
              (in_stack_fffffffffffffde0);
    lexeme_t<cfgfile::string_trait_t>::~lexeme_t((lexeme_t<cfgfile::string_trait_t> *)0x1466e0);
  }
  return;
}

Assistant:

void parse( const typename Trait::string_t & file_name ) override
	{
		if( !start_first_tag_parsing() )
			return;

		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		while( !lexeme.is_null() )
		{
			if( !this->m_stack.empty() )
			{
				switch( lexeme.type() )
				{
					case lexeme_type_t::start :
						start_tag_parsing( *this->m_stack.top(),
							this->m_stack.top()->children() );
						break;

					case lexeme_type_t::string :
						this->m_stack.top()->on_string( parser_info_t< Trait >(
								file_name,
								m_lex.line_number(),
								m_lex.column_number() ),
							lexeme.value() );
						break;

					case lexeme_type_t::finish :
					{
						this->m_stack.top()->on_finish( parser_info_t< Trait >(
							file_name,
							m_lex.line_number(),
							m_lex.column_number() ) );
						this->m_stack.pop();
					}
						break;

					default:
						break;
				}
			}
			else
				throw exception_t< Trait >(
					Trait::from_ascii( "Unexpected content. "
						"We've finished parsing, but we've got this: \"" ) +
					lexeme.value() + Trait::from_ascii( "\". " ) +
					Trait::from_ascii( "In file \"" ) + file_name +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( m_lex.line_number() ) +
					Trait::from_ascii( "." ) );


			lexeme = m_lex.next_lexeme();
		}

		this->check_parser_state_after_parsing();
	}